

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int GetNMEASentenceFromThreadubloxx(UBLOX *publox,NMEADATA *pNMEAData)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  NMEADATA *pNMEAData_local;
  UBLOX *publox_local;
  
  local_24 = 0;
  do {
    if ((UBLOX *)addrsublox[local_24] == publox) {
      EnterCriticalSection(ubloxCS + local_24);
      memcpy(pNMEAData,nmeadataublox + local_24,0x3d8);
      iVar1 = resublox[local_24];
      LeaveCriticalSection(ubloxCS + local_24);
      return iVar1;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetNMEASentenceFromThreadubloxx(UBLOX* publox, NMEADATA* pNMEAData)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&ubloxCS[id]);
	*pNMEAData = nmeadataublox[id];
	res = resublox[id];
	LeaveCriticalSection(&ubloxCS[id]);

	return res;
}